

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QString * __thiscall
QMap<QString,_QString>::value(QMap<QString,_QString> *this,QString *key,QString *defaultValue)

{
  bool bVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
  *in_stack_ffffffffffffffa8;
  QString *this_00;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                      *)0x143a16);
  if (bVar1) {
    local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                  *)0x143a44);
    local_10._M_node =
         (_Base_ptr)
         std::
         map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x143a55);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
                  *)0x143a64);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
         ::cend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (bVar1) {
      std::_Rb_tree_const_iterator<std::pair<const_QString,_QString>_>::operator->
                ((_Rb_tree_const_iterator<std::pair<const_QString,_QString>_> *)0x143a94);
      QString::QString(this_00,(QString *)in_stack_ffffffffffffffa8);
    }
    else {
      QString::QString(this_00,(QString *)in_stack_ffffffffffffffa8);
    }
  }
  else {
    QString::QString(this_00,(QString *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }